

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

void __thiscall QMainWindow::removeDockWidget(QMainWindow *this,QDockWidget *dockwidget)

{
  long in_RSI;
  QWidget *unaff_retaddr;
  
  if (in_RSI != 0) {
    d_func((QMainWindow *)0x5ea7ac);
    QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5ea7bb);
    QLayout::removeWidget((QLayout *)dockwidget,unaff_retaddr);
    QWidget::hide((QWidget *)0x5ea7d2);
  }
  return;
}

Assistant:

void QMainWindow::removeDockWidget(QDockWidget *dockwidget)
{
    if (dockwidget) {
        d_func()->layout->removeWidget(dockwidget);
        dockwidget->hide();
    }
}